

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  GLFWmonitor *pGVar2;
  GLFWvidmode *pGVar3;
  int ypos;
  uint value;
  int xpos;
  int height;
  int refreshRate;
  
  glfwGetTime();
  printf("%0.2f Key %s\n");
  if (action == 1) {
    if (key < 0x52) {
      switch(key) {
      case 0x41:
        iVar1 = glfwGetWindowAttrib(window,0x20006);
        value = (uint)(iVar1 == 0);
        iVar1 = 0x20006;
        break;
      case 0x42:
        iVar1 = glfwGetWindowAttrib(window,0x20003);
        value = (uint)(iVar1 == 0);
        iVar1 = 0x20003;
        break;
      default:
        goto switchD_00115f00_caseD_43;
      case 0x44:
        iVar1 = glfwGetWindowAttrib(window,0x20005);
        value = (uint)(iVar1 == 0);
        iVar1 = 0x20005;
        break;
      case 0x46:
        iVar1 = glfwGetWindowAttrib(window,0x20007);
        value = (uint)(iVar1 == 0);
        iVar1 = 0x20007;
        break;
      case 0x49:
        glfwIconifyWindow(window);
        return;
      case 0x4d:
        glfwMaximizeWindow(window);
        return;
      }
      glfwSetWindowAttrib(window,iVar1,value);
      return;
    }
    if (key < 0x101) {
      if (key == 0x52) {
        glfwRestoreWindow(window);
        return;
      }
      if (key == 0x100) {
        glfwSetWindowShouldClose(window,1);
        return;
      }
    }
    else if (((key == 0x101) || (key == 300)) && (mods == 4)) {
      pGVar2 = glfwGetWindowMonitor(window);
      if (pGVar2 == (GLFWmonitor *)0x0) {
        pGVar2 = glfwGetPrimaryMonitor();
        if (pGVar2 == (GLFWmonitor *)0x0) {
          return;
        }
        pGVar3 = glfwGetVideoMode(pGVar2);
        glfwGetWindowPos(window,&windowed_xpos,&windowed_ypos);
        glfwGetWindowSize(window,&windowed_width,&windowed_height);
        iVar1 = pGVar3->width;
        height = pGVar3->height;
        refreshRate = pGVar3->refreshRate;
        xpos = 0;
        ypos = 0;
      }
      else {
        refreshRate = 0;
        pGVar2 = (GLFWmonitor *)0x0;
        xpos = windowed_xpos;
        ypos = windowed_ypos;
        iVar1 = windowed_width;
        height = windowed_height;
      }
      glfwSetWindowMonitor(window,pGVar2,xpos,ypos,iVar1,height,refreshRate);
    }
  }
switchD_00115f00_caseD_43:
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    printf("%0.2f Key %s\n",
           glfwGetTime(),
           action == GLFW_PRESS ? "pressed" : "released");

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_I:
            glfwIconifyWindow(window);
            break;
        case GLFW_KEY_M:
            glfwMaximizeWindow(window);
            break;
        case GLFW_KEY_R:
            glfwRestoreWindow(window);
            break;
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_A:
            glfwSetWindowAttrib(window, GLFW_AUTO_ICONIFY, !glfwGetWindowAttrib(window, GLFW_AUTO_ICONIFY));
            break;
        case GLFW_KEY_B:
            glfwSetWindowAttrib(window, GLFW_RESIZABLE, !glfwGetWindowAttrib(window, GLFW_RESIZABLE));
            break;
        case GLFW_KEY_D:
            glfwSetWindowAttrib(window, GLFW_DECORATED, !glfwGetWindowAttrib(window, GLFW_DECORATED));
            break;
        case GLFW_KEY_F:
            glfwSetWindowAttrib(window, GLFW_FLOATING, !glfwGetWindowAttrib(window, GLFW_FLOATING));
            break;
        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
            {
                glfwSetWindowMonitor(window, NULL,
                                     windowed_xpos, windowed_ypos,
                                     windowed_width, windowed_height,
                                     0);
            }
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                if (monitor)
                {
                    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                    glfwGetWindowPos(window, &windowed_xpos, &windowed_ypos);
                    glfwGetWindowSize(window, &windowed_width, &windowed_height);
                    glfwSetWindowMonitor(window, monitor,
                                         0, 0, mode->width, mode->height,
                                         mode->refreshRate);
                }
            }

            break;
        }
    }
}